

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O1

ostream * benchmark::internal::GetNullLogInstance(void)

{
  int iVar1;
  
  if (GetNullLogInstance()::log_buff == '\0') {
    GetNullLogInstance();
  }
  if (GetNullLogInstance()::null_log == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNullLogInstance()::null_log);
    if (iVar1 != 0) {
      std::ostream::ostream
                (GetNullLogInstance()::null_log,&GetNullLogInstance::log_buff.super_streambuf);
      __cxa_atexit(std::ostream::~ostream,GetNullLogInstance()::null_log,&__dso_handle);
      __cxa_guard_release(&GetNullLogInstance()::null_log);
    }
  }
  return (ostream *)GetNullLogInstance()::null_log;
}

Assistant:

std::ostream& GetNullLogInstance() {
  static NullLogBuffer log_buff;
  static std::ostream null_log(&log_buff);
  return null_log;
}